

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::DeepTiledOutputFile::Data::~Data(Data *this)

{
  BufferedTile *this_00;
  pointer ppTVar1;
  TileBuffer *this_01;
  long *plVar2;
  pointer ppTVar3;
  _Base_ptr p_Var4;
  size_t i;
  ulong uVar5;
  size_t i_1;
  
  if (this->numXTiles != (int *)0x0) {
    operator_delete__(this->numXTiles);
  }
  if (this->numYTiles != (int *)0x0) {
    operator_delete__(this->numYTiles);
  }
  for (p_Var4 = (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->tileMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    this_00 = (BufferedTile *)p_Var4[1]._M_left;
    if (this_00 != (BufferedTile *)0x0) {
      anon_unknown_8::BufferedTile::~BufferedTile(this_00);
    }
    operator_delete(this_00,0x28);
  }
  uVar5 = 0;
  while( true ) {
    ppTVar1 = (this->tileBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->tileBuffers).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar5)
    break;
    this_01 = ppTVar1[uVar5];
    if (this_01 != (TileBuffer *)0x0) {
      if (*(long **)&this_01->dy != (long *)0x0) {
        (**(code **)(**(long **)&this_01->dy + 8))();
      }
      plVar2 = *(long **)((long)&(this_01->exception).field_2 + 8);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      IlmThread_2_5::Semaphore::~Semaphore((Semaphore *)&this_01[1].dataSize);
      std::__cxx11::string::~string((string *)&this_01->field_0x70);
      Array<char>::~Array((Array<char> *)&this_01->ly);
      Array<char>::~Array((Array<char> *)this_01);
      operator_delete(this_01,0xb8);
    }
    uVar5 = uVar5 + 1;
  }
  for (uVar5 = 0;
      ppTVar3 = (this->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->slices).
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3);
      uVar5 = uVar5 + 1) {
    operator_delete(ppTVar3[uVar5],0x38);
  }
  std::
  map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
  ::~map(&this->tileMap);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::~vector(&this->tileBuffers);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ::~vector(&this->slices);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&(this->tileOffsets)._offsets);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepTiledOutputFile::Data::~Data ()
{
    delete [] numXTiles;
    delete [] numYTiles;

    //
    // Delete all the tile buffers, if any still happen to exist
    //

    for (TileMap::iterator i = tileMap.begin(); i != tileMap.end(); ++i)
        delete i->second;

    for (size_t i = 0; i < tileBuffers.size(); i++)
        if (tileBuffers[i] != 0)
            delete tileBuffers[i];

    for (size_t i = 0; i < slices.size(); i++)
        delete slices[i];
}